

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squared_loss.cc
# Opt level: O0

void __thiscall
xLearn::SquaredLoss::Evaluate
          (SquaredLoss *this,vector<float,_std::allocator<float>_> *pred,
          vector<float,_std::allocator<float>_> *label)

{
  bool bVar1;
  ostream *poVar2;
  size_type sVar3;
  vector<float,_std::allocator<float>_> **__args_1;
  reference pvVar4;
  vector<float,_std::allocator<float>_> *in_RSI;
  long in_RDI;
  size_t i_1;
  size_t end_idx;
  size_t start_idx;
  int i;
  vector<float,_std::allocator<float>_> sum;
  allocator_type *in_stack_fffffffffffffd78;
  unsigned_long *__args_3;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffd80;
  size_type in_stack_fffffffffffffd88;
  vector<float,_std::allocator<float>_> *this_00;
  _func_void_vector<float,_std::allocator<float>_>_ptr_vector<float,_std::allocator<float>_>_ptr_float_ptr_unsigned_long_unsigned_long
  *__f;
  undefined8 in_stack_fffffffffffffda8;
  ThreadPool *in_stack_fffffffffffffdb0;
  string *in_stack_fffffffffffffde8;
  undefined8 in_stack_fffffffffffffdf0;
  int line;
  string *in_stack_fffffffffffffdf8;
  undefined8 in_stack_fffffffffffffe00;
  LogSeverity severity;
  _Bind<void_(*(const_std::vector<float,_std::allocator<float>_>_*,_const_std::vector<float,_std::allocator<float>_>_*,_float_*,_unsigned_long,_unsigned_long))(const_std::vector<float,_std::allocator<float>_>_*,_const_std::vector<float,_std::allocator<float>_>_*,_float_*,_unsigned_long,_unsigned_long)>
  *in_stack_fffffffffffffe20;
  ThreadPool *in_stack_fffffffffffffe28;
  ulong local_168;
  int local_f4;
  undefined1 local_ed;
  undefined4 local_ec;
  vector<float,_std::allocator<float>_> local_e8;
  allocator local_c9;
  string local_c8 [39];
  allocator local_a1;
  string local_a0 [32];
  Logger local_80;
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [36];
  Logger local_1c [3];
  vector<float,_std::allocator<float>_> *local_10;
  
  severity = (LogSeverity)((ulong)in_stack_fffffffffffffe00 >> 0x20);
  line = (int)((ulong)in_stack_fffffffffffffdf0 >> 0x20);
  local_10 = in_RSI;
  bVar1 = std::vector<float,_std::allocator<float>_>::empty(in_stack_fffffffffffffd80);
  if (bVar1) {
    Logger::Logger(local_1c,ERR);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/loss/squared_loss.cc"
               ,&local_41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"Evaluate",&local_79);
    poVar2 = Logger::Start(severity,in_stack_fffffffffffffdf8,line,in_stack_fffffffffffffde8);
    poVar2 = std::operator<<(poVar2,"CHECK_NE failed ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/loss/squared_loss.cc"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x37);
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"pred.empty()");
    poVar2 = std::operator<<(poVar2," = ");
    bVar1 = std::vector<float,_std::allocator<float>_>::empty(in_stack_fffffffffffffd80);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,bVar1);
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"true");
    poVar2 = std::operator<<(poVar2," = ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,true);
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    Logger::~Logger((Logger *)in_stack_fffffffffffffd80);
    abort();
  }
  bVar1 = std::vector<float,_std::allocator<float>_>::empty(in_stack_fffffffffffffd80);
  if (bVar1) {
    Logger::Logger(&local_80,ERR);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_a0,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/loss/squared_loss.cc"
               ,&local_a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c8,"Evaluate",&local_c9);
    poVar2 = Logger::Start(severity,in_stack_fffffffffffffdf8,line,in_stack_fffffffffffffde8);
    poVar2 = std::operator<<(poVar2,"CHECK_NE failed ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/loss/squared_loss.cc"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x38);
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"label.empty()");
    poVar2 = std::operator<<(poVar2," = ");
    bVar1 = std::vector<float,_std::allocator<float>_>::empty(in_stack_fffffffffffffd80);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,bVar1);
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"true");
    poVar2 = std::operator<<(poVar2," = ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,true);
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string(local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    std::__cxx11::string::~string(local_a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
    Logger::~Logger((Logger *)in_stack_fffffffffffffd80);
    abort();
  }
  sVar3 = std::vector<float,_std::allocator<float>_>::size(local_10);
  *(int *)(in_RDI + 0x2c) = *(int *)(in_RDI + 0x2c) + (int)sVar3;
  this_00 = *(vector<float,_std::allocator<float>_> **)(in_RDI + 0x20);
  local_ec = 0;
  __f = (_func_void_vector<float,_std::allocator<float>_>_ptr_vector<float,_std::allocator<float>_>_ptr_float_ptr_unsigned_long_unsigned_long
         *)&local_ed;
  std::allocator<float>::allocator((allocator<float> *)0x1ded35);
  std::vector<float,_std::allocator<float>_>::vector
            (this_00,in_stack_fffffffffffffd88,(value_type_conflict *)in_stack_fffffffffffffd80,
             in_stack_fffffffffffffd78);
  std::allocator<float>::~allocator((allocator<float> *)0x1ded63);
  for (local_f4 = 0; (ulong)(long)local_f4 < *(ulong *)(in_RDI + 0x20); local_f4 = local_f4 + 1) {
    sVar3 = std::vector<float,_std::allocator<float>_>::size(local_10);
    __args_1 = (vector<float,_std::allocator<float>_> **)
               getStart(sVar3,*(size_t *)(in_RDI + 0x20),(long)local_f4);
    sVar3 = std::vector<float,_std::allocator<float>_>::size(local_10);
    in_stack_fffffffffffffd80 =
         (vector<float,_std::allocator<float>_> *)
         getEnd(sVar3,*(size_t *)(in_RDI + 0x20),(long)local_f4);
    __args_3 = *(unsigned_long **)(in_RDI + 0x18);
    std::vector<float,_std::allocator<float>_>::operator[](&local_e8,(long)local_f4);
    std::
    bind<void(&)(std::vector<float,std::allocator<float>>const*,std::vector<float,std::allocator<float>>const*,float*,unsigned_long,unsigned_long),std::vector<float,std::allocator<float>>const*,std::vector<float,std::allocator<float>>const*,float*,unsigned_long&,unsigned_long&>
              (__f,(vector<float,_std::allocator<float>_> **)this_00,__args_1,
               (float **)in_stack_fffffffffffffd80,__args_3,
               (unsigned_long *)in_stack_fffffffffffffdb0);
    ThreadPool::
    enqueue<std::_Bind<void(*(std::vector<float,std::allocator<float>>const*,std::vector<float,std::allocator<float>>const*,float*,unsigned_long,unsigned_long))(std::vector<float,std::allocator<float>>const*,std::vector<float,std::allocator<float>>const*,float*,unsigned_long,unsigned_long)>>
              (in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
    std::future<void>::~future((future<void> *)0x1deebd);
  }
  ThreadPool::Sync(in_stack_fffffffffffffdb0,(int)((ulong)in_stack_fffffffffffffda8 >> 0x20));
  local_168 = 0;
  while( true ) {
    sVar3 = std::vector<float,_std::allocator<float>_>::size(&local_e8);
    if (sVar3 <= local_168) break;
    pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](&local_e8,local_168);
    *(float *)(in_RDI + 0x28) = *pvVar4 + *(float *)(in_RDI + 0x28);
    local_168 = local_168 + 1;
  }
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_fffffffffffffd80);
  return;
}

Assistant:

void SquaredLoss::Evaluate(const std::vector<real_t>& pred,
                          const std::vector<real_t>& label) {
  CHECK_NE(pred.empty(), true);
  CHECK_NE(label.empty(), true);
  total_example_ += pred.size();
  // multi-thread training
  std::vector<real_t> sum(threadNumber_, 0);
  for (int i = 0; i < threadNumber_; ++i) {
    size_t start_idx = getStart(pred.size(), threadNumber_, i);
    size_t end_idx = getEnd(pred.size(), threadNumber_, i);
    pool_->enqueue(std::bind(sq_evaluate_thread,
                             &pred,
                             &label,
                             &(sum[i]),
                             start_idx,
                             end_idx));
  }
  // Wait all of the threads finish their job
  pool_->Sync(threadNumber_);
  // Accumulate loss
  for (size_t i = 0; i < sum.size(); ++i) {
    loss_sum_ += sum[i];
  }
}